

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itch50_handler.cc
# Opt level: O3

void __thiscall
helix::nasdaq::itch50_handler::process_msg(itch50_handler *this,itch50_stock_trading_action *m)

{
  byte bVar1;
  iterator iVar2;
  invalid_argument *this_00;
  undefined1 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  local_60._M_dataplus._M_p = (pointer)(ulong)m->StockLocate;
  iVar2 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_helix::order_book>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->order_book_id_map)._M_h,(key_type *)&local_60);
  if (iVar2.super__Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false>.
      _M_cur != (__node_type *)0x0) {
    bVar1 = m->TradingState;
    if (bVar1 < 0x51) {
      uVar3 = 1;
      if (bVar1 != 0x48) {
        if (bVar1 != 0x50) {
LAB_00113747:
          this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_80,"invalid trading state: ","");
          std::__cxx11::to_string(&local_40,(int)m->TradingState);
          std::operator+(&local_60,&local_80,&local_40);
          std::invalid_argument::invalid_argument(this_00,(string *)&local_60);
          __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        uVar3 = 2;
      }
    }
    else if (bVar1 == 0x51) {
      uVar3 = 3;
    }
    else {
      if (bVar1 != 0x54) goto LAB_00113747;
      uVar3 = 4;
    }
    *(undefined1 *)
     ((long)iVar2.
            super__Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false>.
            _M_cur + 0x38) = uVar3;
  }
  return;
}

Assistant:

void itch50_handler::process_msg(const itch50_stock_trading_action* m)
{
    auto it = order_book_id_map.find(m->StockLocate);
    if (it != order_book_id_map.end()) {
        auto& ob = it->second;

        switch (m->TradingState) {
        case 'H': ob.set_state(trading_state::halted); break;
        case 'P': ob.set_state(trading_state::paused); break;
        case 'Q': ob.set_state(trading_state::quotation_only); break;
        case 'T': ob.set_state(trading_state::trading); break;
        default:  throw std::invalid_argument(std::string("invalid trading state: ") + std::to_string(m->TradingState));
        }
    }
}